

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::GenerateAppleInfoPList
          (cmLocalGenerator *this,cmGeneratorTarget *target,string *targetName,string *fname)

{
  cmMakefile *this_00;
  string_view name;
  ScopePushPop SVar1;
  cmValue outfile;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  string *psVar5;
  cmNewLineStyle local_3f0;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  string_view local_2b0;
  allocator<char> local_299;
  string local_298;
  ScopePushPop local_278;
  ScopePushPop varScope;
  cmMakefile *mf;
  string local_260;
  undefined1 local_240 [8];
  ostringstream e;
  undefined1 local_b8 [8];
  string inMod;
  undefined1 local_88 [8];
  string inFile;
  allocator<char> local_51;
  string local_50;
  cmValue local_30;
  cmValue in;
  string *fname_local;
  string *targetName_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  
  in.Value = fname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"MACOSX_BUNDLE_INFO_PLIST",&local_51);
  local_30 = cmGeneratorTarget::GetProperty(target,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar2 = cmNonempty(local_30);
  inMod.field_2._M_local_buf[0xe] = '\0';
  if (bVar2) {
    psVar5 = cmValue::operator*[abi_cxx11_(&local_30);
    std::__cxx11::string::string((string *)local_88,(string *)psVar5);
  }
  else {
    std::allocator<char>::allocator();
    inMod.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"MacOSXBundleInfo.plist.in",
               (allocator<char> *)(inMod.field_2._M_local_buf + 0xf));
  }
  if ((inMod.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(inMod.field_2._M_local_buf + 0xf));
  }
  bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_88);
  if (!bVar2) {
    this_00 = this->Makefile;
    name = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_88)
    ;
    cmMakefile::GetModulesFile_abi_cxx11_((string *)local_b8,this_00,name);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::__cxx11::string::operator=((string *)local_88,(string *)local_b8);
    }
    std::__cxx11::string::~string((string *)local_b8);
  }
  bVar2 = cmsys::SystemTools::FileExists((string *)local_88,true);
  if (bVar2) {
    varScope.Makefile = this->Makefile;
    cmMakefile::ScopePushPop::ScopePushPop(&local_278,varScope.Makefile);
    SVar1.Makefile = varScope.Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,"MACOSX_BUNDLE_EXECUTABLE_NAME",&local_299);
    local_2b0 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)targetName);
    cmMakefile::AddDefinition(SVar1.Makefile,&local_298,local_2b0);
    std::__cxx11::string::~string((string *)&local_298);
    std::allocator<char>::~allocator(&local_299);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"MACOSX_BUNDLE_INFO_STRING",&local_2d1);
    cmLGInfoProp(SVar1.Makefile,target,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"MACOSX_BUNDLE_ICON_FILE",&local_2f9);
    cmLGInfoProp(SVar1.Makefile,target,&local_2f8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"MACOSX_BUNDLE_GUI_IDENTIFIER",&local_321);
    cmLGInfoProp(SVar1.Makefile,target,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"MACOSX_BUNDLE_LONG_VERSION_STRING",&local_349);
    cmLGInfoProp(SVar1.Makefile,target,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"MACOSX_BUNDLE_BUNDLE_NAME",&local_371);
    cmLGInfoProp(SVar1.Makefile,target,&local_370);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"MACOSX_BUNDLE_SHORT_VERSION_STRING",&local_399);
    cmLGInfoProp(SVar1.Makefile,target,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"MACOSX_BUNDLE_BUNDLE_VERSION",&local_3c1);
    cmLGInfoProp(SVar1.Makefile,target,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
    SVar1 = varScope;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,"MACOSX_BUNDLE_COPYRIGHT",&local_3e9);
    cmLGInfoProp(SVar1.Makefile,target,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    outfile = in;
    SVar1 = varScope;
    cmNewLineStyle::cmNewLineStyle(&local_3f0);
    cmMakefile::ConfigureFile
              (SVar1.Makefile,(string *)local_88,outfile.Value,false,false,false,0,local_3f0);
    cmMakefile::ScopePushPop::~ScopePushPop(&local_278);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
    poVar4 = std::operator<<((ostream *)local_240,"Target ");
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    poVar4 = std::operator<<(poVar4,(string *)psVar5);
    poVar4 = std::operator<<(poVar4," Info.plist template \"");
    poVar4 = std::operator<<(poVar4,(string *)local_88);
    std::operator<<(poVar4,"\" could not be found.");
    std::__cxx11::ostringstream::str();
    cmSystemTools::Error(&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
  }
  std::__cxx11::string::~string((string *)local_88);
  return;
}

Assistant:

void cmLocalGenerator::GenerateAppleInfoPList(cmGeneratorTarget* target,
                                              const std::string& targetName,
                                              const std::string& fname)
{
  // Find the Info.plist template.
  cmValue in = target->GetProperty("MACOSX_BUNDLE_INFO_PLIST");
  std::string inFile = cmNonempty(in) ? *in : "MacOSXBundleInfo.plist.in";
  if (!cmSystemTools::FileIsFullPath(inFile)) {
    std::string inMod = this->Makefile->GetModulesFile(inFile);
    if (!inMod.empty()) {
      inFile = inMod;
    }
  }
  if (!cmSystemTools::FileExists(inFile, true)) {
    std::ostringstream e;
    e << "Target " << target->GetName() << " Info.plist template \"" << inFile
      << "\" could not be found.";
    cmSystemTools::Error(e.str());
    return;
  }

  // Convert target properties to variables in an isolated makefile
  // scope to configure the file.  If properties are set they will
  // override user make variables.  If not the configuration will fall
  // back to the directory-level values set by the user.
  cmMakefile* mf = this->Makefile;
  cmMakefile::ScopePushPop varScope(mf);
  mf->AddDefinition("MACOSX_BUNDLE_EXECUTABLE_NAME", targetName);
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_INFO_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_ICON_FILE");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_GUI_IDENTIFIER");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_LONG_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_BUNDLE_NAME");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_SHORT_VERSION_STRING");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_BUNDLE_VERSION");
  cmLGInfoProp(mf, target, "MACOSX_BUNDLE_COPYRIGHT");
  mf->ConfigureFile(inFile, fname, false, false, false);
}